

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O3

void duckdb::BinaryExecutor::
     ExecuteConstant<duckdb::string_t,duckdb::string_t,long,duckdb::BinaryStandardOperatorWrapper,duckdb::InstrOperator,bool>
               (Vector *left,Vector *right,Vector *result,bool fun)

{
  unsigned_long *puVar1;
  long *plVar2;
  bool bVar3;
  idx_t strlen;
  utf8proc_ssize_t uVar4;
  idx_t iVar5;
  long lVar6;
  undefined8 str;
  anon_union_16_2_67f50693_for_value local_50;
  utf8proc_int32_t local_3c;
  anon_union_16_2_67f50693_for_value local_38;
  
  Vector::SetVectorType(result,CONSTANT_VECTOR);
  puVar1 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
  plVar2 = (long *)result->data;
  if (((puVar1 == (unsigned_long *)0x0) || ((*puVar1 & 1) != 0)) &&
     ((puVar1 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask,
      puVar1 == (unsigned_long *)0x0 || ((*puVar1 & 1) != 0)))) {
    local_50._0_8_ = *(undefined8 *)left->data;
    local_50.pointer.ptr = (char *)*(undefined8 *)(left->data + 8);
    local_38._0_8_ = *(undefined8 *)right->data;
    local_38.pointer.ptr = (char *)*(undefined8 *)(right->data + 8);
    strlen = FindStrInStr((string_t *)&local_50.pointer,(string_t *)&local_38.pointer);
    if (strlen == 0xffffffffffffffff) {
      lVar6 = 0;
    }
    else if ((long)strlen < 1) {
      lVar6 = 1;
    }
    else {
      str = local_50.pointer.ptr;
      if (local_50.pointer.length < 0xd) {
        str = local_50.pointer.prefix;
      }
      lVar6 = 1;
      do {
        uVar4 = utf8proc_iterate((utf8proc_uint8_t *)str,strlen,&local_3c);
        str = str + uVar4;
        lVar6 = lVar6 + 1;
        iVar5 = strlen - uVar4;
        bVar3 = uVar4 <= (long)strlen;
        strlen = iVar5;
      } while (iVar5 != 0 && bVar3);
    }
    *plVar2 = lVar6;
    return;
  }
  ConstantVector::SetNull(result,true);
  return;
}

Assistant:

static void ExecuteConstant(Vector &left, Vector &right, Vector &result, FUNC fun) {
		result.SetVectorType(VectorType::CONSTANT_VECTOR);

		auto ldata = ConstantVector::GetData<LEFT_TYPE>(left);
		auto rdata = ConstantVector::GetData<RIGHT_TYPE>(right);
		auto result_data = ConstantVector::GetData<RESULT_TYPE>(result);

		if (ConstantVector::IsNull(left) || ConstantVector::IsNull(right)) {
			ConstantVector::SetNull(result, true);
			return;
		}
		*result_data = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
		    fun, *ldata, *rdata, ConstantVector::Validity(result), 0);
	}